

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>>
          (BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,Pair<unsigned_int,_unsigned_int,_DefaultComparer> *key)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  uint uVar4;
  long lVar5;
  int *piVar6;
  int extraout_EDX;
  int iVar7;
  DictionaryStats *this_00;
  int iVar8;
  undefined1 auVar9 [16];
  
  lVar5 = *(long *)this;
  if (lVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,(key->second + key->first) * 2 + 1);
    piVar6 = (int *)(lVar5 + (ulong)uVar4 * 4);
    uVar1 = key->first;
    uVar3 = key->second;
    uVar4 = 0;
    iVar7 = extraout_EDX;
    while( true ) {
      iVar8 = *piVar6;
      if ((long)iVar8 < 0) break;
      lVar5 = (long)iVar8 * 0x18;
      uVar2 = *(undefined8 *)(*(long *)(this + 8) + 0xc + lVar5);
      auVar9._0_4_ = -(uint)((int)uVar2 == uVar1);
      auVar9._4_4_ = -(uint)((int)((ulong)uVar2 >> 0x20) == uVar3);
      auVar9._8_4_ = 0xffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar9 = pmovsxdq(auVar9,auVar9);
      iVar7 = movmskpd(iVar7,auVar9);
      if (iVar7 == 3) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_0046791e;
      }
      uVar4 = uVar4 + 1;
      piVar6 = (int *)(lVar5 + *(long *)(this + 8) + 8);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar8 = -1;
LAB_0046791e:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  return iVar8;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }